

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gwham.hpp
# Opt level: O1

valtype __thiscall
WHAM<std::shared_ptr<Ensemble>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_long,_double>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double,_double>_>
::whamvsrawi(WHAM<std::shared_ptr<Ensemble>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_long,_double>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double,_double>_>
             *this,uint *i,
            gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double,_double> *rho)

{
  ulong *this_00;
  pointer *__return_storage_ptr__;
  double dVar1;
  pointer puVar2;
  uint uVar3;
  pointer psVar4;
  element_type *peVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_long,_double> *pgVar6;
  const_iterator cVar7;
  long lVar8;
  double dVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  double dVar12;
  undefined1 local_160 [8];
  gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_long,_double> hist;
  coordtype coord;
  vector<double,_std::allocator<double>_> vals;
  double local_38;
  
  gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_long,_double>::gnarray
            ((gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_long,_double>
              *)local_160,
             (this->hists->
             super__Vector_base<gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_long,_double>,_std::allocator<gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_long,_double>_>_>
             )._M_impl.super__Vector_impl_data._M_start + *i);
  if ((gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_long,_double> *)
      hist.narr._M_t._M_impl.super__Rb_tree_header._M_header._M_parent == &hist) {
    vals.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
  }
  else {
    lVar8 = 0;
    pgVar6 = (gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_long,_double>
              *)hist.narr._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    do {
      lVar8 = (long)(pgVar6->nelms).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start + lVar8;
      pgVar6 = (gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_long,_double>
                *)std::_Rb_tree_increment((_Rb_tree_node_base *)pgVar6);
    } while (pgVar6 != &hist);
    auVar10._8_4_ = (int)((ulong)lVar8 >> 0x20);
    auVar10._0_8_ = lVar8;
    auVar10._12_4_ = 0x45300000;
    vals.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage =
         (pointer)((auVar10._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)lVar8) - 4503599627370496.0));
  }
  uVar3 = *i;
  dVar1 = (this->expf).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[uVar3];
  psVar4 = (this->V->
           super__Vector_base<std::shared_ptr<Ensemble>,_std::allocator<std::shared_ptr<Ensemble>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  peVar5 = psVar4[uVar3].super___shared_ptr<Ensemble,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  this_01 = psVar4[uVar3].super___shared_ptr<Ensemble,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
  ;
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_01->_M_use_count = this_01->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_01->_M_use_count = this_01->_M_use_count + 1;
    }
  }
  if ((gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_long,_double> *)
      hist.narr._M_t._M_impl.super__Rb_tree_header._M_header._M_parent == &hist) {
    local_38 = 0.0;
  }
  else {
    local_38 = 0.0;
    this_00 = &hist.nelms_tot;
    __return_storage_ptr__ =
         &coord.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage;
    pgVar6 = (gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_long,_double>
              *)hist.narr._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    do {
      puVar2 = (pgVar6->nelms).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start;
      auVar11._0_8_ = (double)CONCAT44(0x43300000,(int)puVar2);
      auVar11._8_4_ = (int)((ulong)puVar2 >> 0x20);
      auVar11._12_4_ = 0x45300000;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this_00,
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 &(pgVar6->narr)._M_t._M_impl.super__Rb_tree_header._M_header._M_right);
      gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_long,_double>::
      coord2val((vector<double,_std::allocator<double>_> *)__return_storage_ptr__,
                (gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_long,_double>
                 *)local_160,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)this_00);
      dVar9 = (double)(**peVar5->_vptr_Ensemble)(peVar5,__return_storage_ptr__);
      dVar9 = exp(-dVar9);
      cVar7 = std::
              _Rb_tree<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double>,_std::_Select1st<std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double>_>,_std::less<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double>_>_>
              ::find((_Rb_tree<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double>,_std::_Select1st<std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double>_>,_std::less<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double>_>_>
                      *)rho,(key_type *)this_00);
      dVar12 = ((auVar11._8_8_ - 1.9342813113834067e+25) + (auVar11._0_8_ - 4503599627370496.0)) /
               (double)vals.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage;
      dVar9 = log(dVar12 / (dVar9 * dVar1 * (double)cVar7._M_node[1]._M_right));
      if (coord.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
        operator_delete(coord.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage);
      }
      if (hist.nelms_tot != 0) {
        operator_delete((void *)hist.nelms_tot);
      }
      local_38 = local_38 + dVar12 * dVar9;
      pgVar6 = (gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_long,_double>
                *)std::_Rb_tree_increment((_Rb_tree_node_base *)pgVar6);
    } while (pgVar6 != &hist);
  }
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
  }
  if (hist.binsize.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
    operator_delete(hist.binsize.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
  }
  if (hist.lv.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage != (pointer)0x0) {
    operator_delete(hist.lv.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
  }
  if (hist.hv.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage != (pointer)0x0) {
    operator_delete(hist.hv.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
  }
  if (hist.nelms.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
    operator_delete(hist.nelms.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  if (hist._48_8_ != 0) {
    operator_delete((void *)hist._48_8_);
  }
  std::
  _Rb_tree<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_long>_>,_std::less<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_long>_>_>
  ::~_Rb_tree((_Rb_tree<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_long>_>,_std::less<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_long>_>_>
               *)local_160);
  return local_38;
}

Assistant:

valtype WHAM<PENSEMBLE,HISTOGRAM,NARRAY>::whamvsrawi(const uint& i, const NARRAY& rho) const {
  const HISTOGRAM hist = (*hists)[i];
  const valtype sum = hist.sum();
  const valtype Qinv = expf[i]; //this is the inverse of the partition function 
  const pEnsemble Vi = (*V)[i];
  typename HISTOGRAM::const_iterator it;
  valtype eta = 0; //eta in equation 41 from reference DOI: 10.1002/jcc.21989
  for(it = hist.begin(); it != hist.end(); ++it) {
    //this is the raw normalized HISTOGRAM from i'th simulation
    const valtype praw = it->second/sum;
    //next we calculate the consensus HISTOGRAM from the WHAM distribution
    const coordtype coord = it->first;
    const vector<valtype> vals = hist.coord2val(coord);
    const valtype pwham = Qinv * exp(-Vi->ener(vals)) * rho[coord];
    //then we calculate eta, the relative entropy between praw and pwham
    eta += praw * log(praw/pwham);
  }
  return eta;
}